

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

void __thiscall OpenMD::SelectionSet::setAll(SelectionSet *this)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0xf0; lVar1 = lVar1 + 0x28) {
    OpenMDBitSet::setAll
              ((OpenMDBitSet *)
               ((long)&(((this->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1));
  }
  return;
}

Assistant:

void SelectionSet::setAll() {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].setAll();
  }